

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,ExpressionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionKind EVar1;
  bool bVar2;
  int iVar3;
  SubroutineKind SVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  ExpressionStatement *stmt;
  CallExpression *pCVar6;
  Type *this;
  Diagnostic *this_00;
  AssignmentExpression *pAVar7;
  UnaryExpression *pUVar8;
  Statement *pSVar9;
  string_view arg;
  SourceRange local_40;
  Expression *args;
  
  if (((stmtCtx->flags).m_bits & 8) != 0) {
    pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
    slang::syntax::BinaryExpressionSyntax::isKind((pEVar5->super_SyntaxNode).kind);
  }
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
  iVar3 = Expression::bind((int)pEVar5,(sockaddr *)context,0x420);
  args = (Expression *)CONCAT44(extraout_var,iVar3);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,&local_40);
  bVar2 = Expression::bad(args);
  if (!bVar2) {
    EVar1 = args->kind;
    if (EVar1 == UnaryOp) {
      pUVar8 = Expression::as<slang::ast::UnaryExpression>(args);
      if (pUVar8->op - Preincrement < 4) {
        return &stmt->super_Statement;
      }
    }
    else {
      if (EVar1 == Assignment) {
        pAVar7 = Expression::as<slang::ast::AssignmentExpression>(args);
        if (pAVar7->timingControl == (TimingControl *)0x0) {
          return &stmt->super_Statement;
        }
        Statement::StatementContext::observeTiming(stmtCtx,pAVar7->timingControl);
        return &stmt->super_Statement;
      }
      if (EVar1 == NewClass) {
        return &stmt->super_Statement;
      }
      if (EVar1 == Call) {
        pCVar6 = Expression::as<slang::ast::CallExpression>(args);
        SVar4 = CallExpression::getSubroutineKind(pCVar6);
        this = not_null<const_slang::ast::Type_*>::get(&args->type);
        bVar2 = Type::isVoid(this);
        if (SVar4 != Function) {
          return &stmt->super_Statement;
        }
        if (bVar2) {
          return &stmt->super_Statement;
        }
        this_00 = ASTContext::addDiag(context,(DiagCode)0x510008,args->sourceRange);
        pCVar6 = Expression::as<slang::ast::CallExpression>(args);
        arg = CallExpression::getSubroutineName(pCVar6);
        Diagnostic::operator<<(this_00,arg);
        return &stmt->super_Statement;
      }
    }
    ASTContext::addDiag(context,(DiagCode)0x140008,args->sourceRange);
  }
  pSVar9 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar9;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const ExpressionStatementSyntax& syntax,
                                           const ASTContext& context, StatementContext& stmtCtx) {
    bitmask<ASTFlags> extraFlags = ASTFlags::AssignmentAllowed | ASTFlags::TopLevelStatement;
    if (stmtCtx.flags.has(StatementFlags::InForLoop) &&
        BinaryExpressionSyntax::isKind(syntax.expr->kind) &&
        !compilation.getOptions().strictDriverChecking) {
        extraFlags |= ASTFlags::UnrollableForLoop;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    // Only a subset of expressions are allowed as statements.
    bool ok;
    switch (expr.kind) {
        case ExpressionKind::Call: {
            auto subKind = expr.as<CallExpression>().getSubroutineKind();
            if (!expr.type->isVoid() && subKind == SubroutineKind::Function) {
                context.addDiag(diag::UnusedResult, expr.sourceRange)
                    << expr.as<CallExpression>().getSubroutineName();
            }
            ok = true;
            break;
        }
        case ExpressionKind::Assignment:
            if (auto timing = expr.as<AssignmentExpression>().timingControl)
                stmtCtx.observeTiming(*timing);

            ok = true;
            break;
        case ExpressionKind::NewClass:
            ok = true;
            break;
        case ExpressionKind::UnaryOp: {
            auto& unary = expr.as<UnaryExpression>();
            ok = unary.op == UnaryOperator::Preincrement ||
                 unary.op == UnaryOperator::Predecrement ||
                 unary.op == UnaryOperator::Postincrement ||
                 unary.op == UnaryOperator::Postdecrement;
            break;
        }
        default:
            ok = false;
            break;
    }

    if (!ok) {
        context.addDiag(diag::ExprNotStatement, expr.sourceRange);
        return badStmt(compilation, result);
    }

    return *result;
}